

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O1

void __thiscall tst_qpromise_then::nullHandler(tst_qpromise_then *this)

{
  QSharedData *pQVar1;
  anon_class_24_3_5928a092 callback;
  anon_class_24_3_5928a092 callback_00;
  Data *pDVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  QArrayData *pQVar6;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar7;
  bool bVar8;
  char cVar9;
  PromiseDataBase<void,_void_()> *this_00;
  char *pcVar10;
  char *pcVar11;
  PromiseData<int> *this_01;
  QPromiseReject<void> *in_R8;
  char *pcVar12;
  QSharedData *pQVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  PromiseResolver<int> resolver_1;
  Promise p_1;
  PromiseResolver<void> resolver;
  Promise p;
  undefined1 local_120 [8];
  Data *local_118;
  QPromiseBase<int> local_110;
  QPromiseBase<int> local_100;
  qsizetype local_f0;
  QArrayData *local_e8;
  pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *ppStack_e0
  ;
  qsizetype local_d8;
  _Any_data local_c8;
  _Any_data *local_b8;
  code *pcStack_b0;
  QArrayData *local_a8;
  _Any_data local_a0;
  _Any_data *local_90;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_80;
  function<void_(const_int_&)> local_78;
  _Any_data local_50;
  code *local_40;
  
  local_e8 = (QArrayData *)CONCAT44(local_e8._4_4_,0x2a);
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            ((QPromiseBase<int> *)&local_78,(anon_class_8_1_a8c68091_conflict)&local_e8);
  local_78.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001327f0;
  local_a0._8_8_ = &local_100;
  local_100._vptr_QPromiseBase = (_func_int **)0x0;
  local_90 = &local_50;
  local_50._M_unused._M_object = (void *)0x0;
  callback.fulfilled._0_4_ = (int)local_a0._8_8_;
  callback.this = (QPromiseBase<int> *)&local_78;
  callback.fulfilled._4_4_ = (int)((ulong)local_a0._8_8_ >> 0x20);
  callback.rejected = (void **)local_90;
  local_a0._M_unused._M_object = &local_78;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            ((QPromiseBase<int> *)&local_c8,callback);
  local_c8._M_unused._M_object = &PTR__QPromiseBase_001327f0;
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)
                     local_78.super__Function_base._M_functor._8_8_);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)
               local_78.super__Function_base._M_functor._8_8_);
  }
  local_78.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001326b8;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_78.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_78.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_78.super__Function_base._M_functor._8_8_
        != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_78.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  local_120._0_4_ = 0xffffffff;
  local_a8 = (QArrayData *)&PTR__QPromiseBase_001326b8;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00132798;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00132720;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = &this_00->super_QSharedData;
  local_a0._M_unused._M_object = &PTR__QPromiseBase_001326e8;
  local_a0._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_100,(QPromise<void> *)&local_a0);
  local_a0._M_unused._M_object = &PTR__QPromiseBase_00132658;
  if ((PromiseDataBase<void,_void_()> *)local_a0._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar13 = (QSharedData *)(local_a0._8_8_ + 8);
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_a0._8_8_ != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (**(code **)(*(long *)local_a0._8_8_ + 8))();
    }
  }
  uVar5 = local_c8._8_8_;
  pp_Var4 = local_100._vptr_QPromiseBase;
  if ((QArrayData *)local_100._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
  }
  local_e8 = (QArrayData *)local_100._vptr_QPromiseBase;
  if ((QArrayData *)local_100._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
  }
  local_110._vptr_QPromiseBase = local_100._vptr_QPromiseBase;
  if ((QArrayData *)local_100._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
    LOCK();
    (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
  }
  local_78.super__Function_base._M_manager = (_Manager_type)0x0;
  local_78._M_invoker = (_Invoker_type)0x0;
  local_78.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(_func_int ***)local_78.super__Function_base._M_functor._M_unused._0_8_ = pp_Var4;
  if ((QArrayData *)pp_Var4 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(_func_int ***)((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 8) = pp_Var4;
  if ((QArrayData *)pp_Var4 == (QArrayData *)0x0) {
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> **)
     ((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)local_120;
    local_78._M_invoker =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_78.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
  }
  else {
    LOCK();
    (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> **)
     ((long)local_78.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)local_120;
    local_78._M_invoker =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_78.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    LOCK();
    (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i == 0) {
      operator_delete(pp_Var4,0x10);
    }
  }
  if ((QArrayData *)pp_Var4 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i == 0) {
      operator_delete(pp_Var4,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)uVar5,&local_78);
  pQVar6 = local_a8;
  if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.super__Function_base._M_manager)
              ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  uVar5 = local_c8._8_8_;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_e8,
             (QPromiseResolve<void> *)&local_110,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)uVar5,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((QArrayData *)local_110._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         == 0) && ((QArrayData *)local_110._vptr_QPromiseBase != (QArrayData *)0x0)) {
      operator_delete(local_110._vptr_QPromiseBase,0x10);
    }
  }
  if (local_e8 != (QArrayData *)0x0) {
    LOCK();
    (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_e8 != (QArrayData *)0x0)) {
      operator_delete(local_e8,0x10);
    }
  }
  if ((QArrayData *)local_100._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((((QBasicAtomicInt *)local_100._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         == 0) && ((QArrayData *)local_100._vptr_QPromiseBase != (QArrayData *)0x0)) {
      operator_delete(local_100._vptr_QPromiseBase,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)local_c8._8_8_);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)local_c8._8_8_);
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  while (bVar8 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
  ;
  cVar9 = QTest::qCompare(local_120._0_4_,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xaa);
  uVar5 = local_c8._8_8_;
  if (cVar9 == '\0') {
    cVar9 = '\0';
  }
  else {
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)local_c8._8_8_);
    bVar8 = (bool)(~bVar8 & (((PromiseError *)(uVar5 + 0x50))->m_data)._M_exception_object ==
                            (void *)0x0);
    local_a0._M_pod_data[0] = bVar8;
    local_100._vptr_QPromiseBase = (_func_int **)CONCAT71(local_100._vptr_QPromiseBase._1_7_,1);
    pcVar10 = QTest::toString<bool>((bool *)local_a0._M_pod_data);
    pcVar11 = QTest::toString<bool>((bool *)&local_100);
    pcVar12 = "p.isFulfilled()";
    cVar9 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar10,pcVar11,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0xab);
  }
  local_c8._M_unused._M_object = pQVar6;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_c8._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_c8._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_c8._8_8_ !=
        (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_c8._8_8_ + 8))();
    }
  }
  if (cVar9 != '\0') {
    QVar14.m_data = (storage_type *)0x3;
    QVar14.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar14);
    local_c8._M_unused._M_object = local_a0._M_unused._M_object;
    local_c8._8_8_ = local_a0._8_8_;
    local_b8 = local_90;
    QtPromise::QPromiseBase<int>::
    QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
              (&local_100,(QString *)&local_c8);
    local_100._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001327f0;
    local_a0._8_8_ = local_120;
    local_120 = (undefined1  [8])0x0;
    local_e8 = (QArrayData *)0x0;
    local_90 = (_Any_data *)&local_e8;
    callback_00.fulfilled._0_4_ = (int)local_a0._8_8_;
    callback_00.this = &local_100;
    callback_00.fulfilled._4_4_ = (int)((ulong)local_a0._8_8_ >> 0x20);
    callback_00.rejected = (void **)local_90;
    local_a0._M_unused._M_object = &local_100;
    QtPromise::QPromiseBase<int>::
    QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
              (&local_110,callback_00);
    local_110._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001327f0;
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar8) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    }
    local_100._vptr_QPromiseBase = (_func_int **)pQVar6;
    if (local_100.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_100.m_d.d != (PromiseData<int> *)0x0)) {
        (*((local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
          [1])();
      }
    }
    if ((QArrayData *)local_c8._M_unused._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_c8._M_unused._0_8_ = *local_c8._M_unused._M_object + -1;
      UNLOCK();
      if (*local_c8._M_unused._M_object == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._M_unused._0_8_,2,8);
      }
    }
    local_e8 = (QArrayData *)0x0;
    ppStack_e0 = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                  *)0x0;
    local_d8 = 0;
    this_01 = (PromiseData<int> *)operator_new(0x68);
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
    *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)&PTR__PromiseDataBase_00132890;
    QReadWriteLock::QReadWriteLock
              (&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)&PTR__PromiseData_00132828;
    (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar13 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_100._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001327f0;
    local_100.m_d.d = this_01;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver
              ((PromiseResolver<int> *)local_120,(QPromise<int> *)&local_100);
    local_100._vptr_QPromiseBase = (_func_int **)pQVar6;
    if (local_100.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_100.m_d.d != (PromiseData<int> *)0x0)) {
        (*((local_100.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
          [1])();
      }
    }
    QVar3.d = local_110.m_d.d;
    if (local_120 != (undefined1  [8])0x0) {
      LOCK();
      (((QSharedData *)local_120)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)local_120)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118 = (Data *)local_120;
    if (local_120 != (undefined1  [8])0x0) {
      LOCK();
      (((QSharedData *)local_120)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)local_120)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_80.d = (Data *)local_120;
    QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              ((function<void_(const_int_&)> *)&local_a0,
               (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_118,
               (QPromiseResolve<int> *)&local_80,(QPromiseReject<int> *)pcVar12);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_a0);
    if (local_90 != (_Any_data *)0x0) {
      (*(code *)local_90)(&local_a0,&local_a0,3);
    }
    QVar7.d = local_80.d;
    QVar3.d = local_110.m_d.d;
    pDVar2 = local_118;
    if (local_118 != (Data *)0x0) {
      LOCK();
      (local_118->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_118->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b8 = (_Any_data *)0x0;
    pcStack_b0 = (code *)0x0;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_c8._M_unused._M_object = operator_new(0x18);
    *(Data **)local_c8._M_unused._0_8_ = pDVar2;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(Data **)((long)local_c8._M_unused._0_8_ + 8) = QVar7.d;
    if (QVar7.d == (Data *)0x0) {
      *(QArrayData ***)((long)local_c8._M_unused._0_8_ + 0x10) = &local_e8;
      pcStack_b0 = std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                   ::_M_invoke;
      local_b8 = (_Any_data *)
                 std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_manager;
    }
    else {
      LOCK();
      ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      *(QArrayData ***)((long)local_c8._M_unused._0_8_ + 0x10) = &local_e8;
      pcStack_b0 = std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                   ::_M_invoke;
      local_b8 = (_Any_data *)
                 std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_manager;
      LOCK();
      ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QVar7.d,0x10);
      }
    }
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar2,0x10);
      }
    }
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_c8);
    pQVar6 = local_a8;
    if (local_b8 != (_Any_data *)0x0) {
      (*(code *)local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            ((local_80.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if (((__int_type)
           ((local_80.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
         (local_80.d != (Data *)0x0)) {
        operator_delete(local_80.d,0x10);
      }
    }
    if (local_118 != (Data *)0x0) {
      LOCK();
      (local_118->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_118->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_118 != (Data *)0x0)) {
        operator_delete(local_118,0x10);
      }
    }
    if (local_120 != (undefined1  [8])0x0) {
      LOCK();
      (((QSharedData *)local_120)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)local_120)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((((QSharedData *)local_120)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_120 != (undefined1  [8])0x0)) {
        operator_delete((void *)local_120,0x10);
      }
    }
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar8) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    }
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
    while (bVar8 != false) {
      QCoreApplication::processEvents();
      QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
      bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
    }
    LOCK();
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*(this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_01)
      ;
    }
    LOCK();
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*(this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_01)
      ;
    }
    QVar15.m_data = (storage_type *)0x3;
    QVar15.m_size = (qsizetype)&local_100;
    QString::fromUtf8(QVar15);
    pp_Var4 = local_100._vptr_QPromiseBase;
    QVar16.m_data = (storage_type_conflict *)ppStack_e0;
    QVar16.m_size = local_d8;
    QVar17.m_data = (storage_type_conflict *)local_100.m_d.d;
    QVar17.m_size = local_f0;
    cVar9 = QTest::qCompare(QVar16,QVar17,"waitForError(p, QString{})","QString{\"foo\"}",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xb0);
    if ((QArrayData *)pp_Var4 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)pp_Var4)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)pp_Var4,2,8);
      }
    }
    if (local_e8 != (QArrayData *)0x0) {
      LOCK();
      (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e8,2,8);
      }
    }
    QVar3.d = local_110.m_d.d;
    if (cVar9 != '\0') {
      bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        (&(local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
      bVar8 = (bool)(~bVar8 & ((QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                              m_data._M_exception_object != (void *)0x0);
      local_100._vptr_QPromiseBase =
           (_func_int **)CONCAT71(local_100._vptr_QPromiseBase._1_7_,bVar8);
      local_e8 = (QArrayData *)CONCAT71(local_e8._1_7_,1);
      pcVar12 = QTest::toString<bool>((bool *)&local_100);
      pcVar10 = QTest::toString<bool>((bool *)&local_e8);
      QTest::compare_helper
                (bVar8,"Compared values are not the same",pcVar12,pcVar10,"p.isRejected()","true",
                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                 ,0xb1);
    }
    local_110._vptr_QPromiseBase = (_func_int **)pQVar6;
    if (local_110.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_110.m_d.d != (PromiseData<int> *)0x0)) {
        (*((local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
          [1])();
      }
    }
  }
  return;
}

Assistant:

void tst_qpromise_then::nullHandler()
{
    { // resolved
        auto p = QtPromise::QPromise<int>::resolve(42).then(nullptr);

        QCOMPARE(waitForValue(p, -1), 42);
        QCOMPARE(p.isFulfilled(), true);
    }
    { // rejected
        auto p = QtPromise::QPromise<int>::reject(QString{"foo"}).then(nullptr);

        QCOMPARE(waitForError(p, QString{}), QString{"foo"});
        QCOMPARE(p.isRejected(), true);
    }
}